

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

void __thiscall llvm::APInt::setBit(APInt *this,uint BitPosition)

{
  APInt *pAVar1;
  
  if (BitPosition <= this->BitWidth) {
    pAVar1 = (APInt *)((ulong)(BitPosition >> 3 & 0xfffffff8) + (long)(this->U).pVal);
    if (this->BitWidth < 0x41) {
      pAVar1 = this;
    }
    (pAVar1->U).VAL = (pAVar1->U).VAL | 1L << ((byte)BitPosition & 0x3f);
    return;
  }
  __assert_fail("BitPosition <= BitWidth && \"BitPosition out of range\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x575,"void llvm::APInt::setBit(unsigned int)");
}

Assistant:

void setBit(unsigned BitPosition) {
    assert(BitPosition <= BitWidth && "BitPosition out of range");
    WordType Mask = maskBit(BitPosition);
    if (isSingleWord())
      U.VAL |= Mask;
    else
      U.pVal[whichWord(BitPosition)] |= Mask;
  }